

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O2

void test_dt_gMonth(void)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  XSValue_Data *pXVar4;
  XSValue *pXVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  void *pvVar9;
  Status SVar10;
  int iVar11;
  Status myStatus;
  StrX local_110;
  char iv_1 [6];
  char v_3 [5];
  char iv_3 [7];
  char iv_2 [9];
  char v_2 [11];
  char v_1 [18];
  undefined8 local_a8;
  undefined8 local_80;
  undefined8 local_58;
  int iVar12;
  
  builtin_strncpy(v_1,"   --02+10:10   \n",0x12);
  builtin_strncpy(v_2,"--10-12:12",0xb);
  builtin_strncpy(v_3,"--12",5);
  builtin_strncpy(iv_1,"--+11",6);
  builtin_strncpy(iv_2,"---02.09",9);
  builtin_strncpy(iv_3,"--14--",7);
  myStatus = st_Init;
  StrX::StrX(&local_110,v_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gMonth,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar2 == '\0') {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1183,v_1,local_110.fLocalForm,1);
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_110,v_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gMonth,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar2 == '\0') {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1184,v_2,local_110.fLocalForm,1);
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_110,v_3);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gMonth,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar2 == '\0') {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1185,v_3,local_110.fLocalForm,1);
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_110,iv_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gMonth,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar2 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      pcVar1 = local_110.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x1188,iv_1,pcVar1,"st_FOCA0002",pcVar6);
      goto LAB_00124671;
    }
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1188,iv_1,local_110.fLocalForm,0);
LAB_00124671:
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_110,iv_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gMonth,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar2 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      pcVar1 = local_110.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x1189,iv_2,pcVar1,"st_FOCA0002",pcVar6);
      goto LAB_0012474f;
    }
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1189,iv_2,local_110.fLocalForm,0);
LAB_0012474f:
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_110,iv_3);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gMonth,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar2 == '\0') {
    if (myStatus == st_FOCA0002) goto LAB_00124833;
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
    pcVar1 = local_110.fLocalForm;
    pcVar6 = getStatusString(myStatus);
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x118a,iv_3,pcVar1,"st_FOCA0002",pcVar6);
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x118a,iv_3,local_110.fLocalForm,0);
  }
  StrX::~StrX(&local_110);
  errSeen = 1;
LAB_00124833:
  iVar12 = 2;
  while (iVar11 = iVar12 + -1, iVar12 != 0) {
    myStatus = st_Init;
    StrX::StrX(&local_110,v_1);
    pvVar9 = (void *)0xd;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gMonth,&myStatus,ver_10,iVar12 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x11a4,v_1);
      StrX::~StrX(&local_110);
      errSeen = 1;
    }
    else {
      bVar3 = compareActualValue(dt_gMonth,*pXVar4,
                                 (XSValue_Data)ZEXT1640(CONCAT88(0x200000000,local_58)));
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    myStatus = st_Init;
    StrX::StrX(&local_110,v_2);
    pvVar9 = (void *)0xd;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gMonth,&myStatus,ver_10,iVar12 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x11a5,v_2);
      StrX::~StrX(&local_110);
      errSeen = 1;
    }
    else {
      bVar3 = compareActualValue(dt_gMonth,*pXVar4,
                                 (XSValue_Data)ZEXT1640(CONCAT88(0xa00000000,local_80)));
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    myStatus = st_Init;
    StrX::StrX(&local_110,v_3);
    pvVar9 = (void *)0xd;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gMonth,&myStatus,ver_10,iVar12 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x11a6,v_3);
      StrX::~StrX(&local_110);
      errSeen = 1;
    }
    else {
      bVar3 = compareActualValue(dt_gMonth,*pXVar4,
                                 (XSValue_Data)ZEXT1640(CONCAT88(0xc00000000,local_a8)));
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    myStatus = st_Init;
    StrX::StrX(&local_110,iv_1);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gMonth,&myStatus,ver_10,iVar12 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
        pcVar1 = local_110.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x11a9,iv_1,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_110);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      pvVar9 = (void *)0x11a9;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x11a9,iv_1);
      StrX::~StrX(&local_110);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    myStatus = st_Init;
    StrX::StrX(&local_110,iv_2);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gMonth,&myStatus,ver_10,iVar12 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
        pcVar1 = local_110.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x11aa,iv_2,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_110);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      pvVar9 = (void *)0x11aa;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x11aa,iv_2);
      StrX::~StrX(&local_110);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    myStatus = st_Init;
    StrX::StrX(&local_110,iv_3);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gMonth,&myStatus,ver_10,iVar12 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    iVar12 = iVar11;
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
        pcVar1 = local_110.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x11ab,iv_3,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_110);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      pvVar9 = (void *)0x11ab;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x11ab,iv_3);
      StrX::~StrX(&local_110);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
  }
  iVar12 = 2;
LAB_00124e91:
  iVar11 = iVar12 + -1;
  if (iVar12 == 0) {
    return;
  }
  myStatus = st_Init;
  StrX::StrX(&local_110,v_1);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_110.fUnicodeForm,dt_gMonth,&myStatus,ver_10,iVar12 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (lVar7 == 0) {
    if (myStatus != st_NoCanRep) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      pcVar1 = local_110.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x11c7,v_1,pcVar1,"st_NoCanRep",pcVar6);
      StrX::~StrX(&local_110);
      goto LAB_00124f89;
    }
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x11c7,v_1);
    StrX::~StrX(&local_110);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
LAB_00124f89:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_110,v_2);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_110.fUnicodeForm,dt_gMonth,&myStatus,ver_10,iVar12 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (lVar7 == 0) {
    if (myStatus != st_NoCanRep) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      pcVar1 = local_110.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x11c8,v_2,pcVar1,"st_NoCanRep",pcVar6);
      StrX::~StrX(&local_110);
      goto LAB_0012507f;
    }
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x11c8,v_2);
    StrX::~StrX(&local_110);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
LAB_0012507f:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_110,v_3);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_110.fUnicodeForm,dt_gMonth,&myStatus,ver_10,iVar12 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (lVar7 == 0) {
    if (myStatus != st_NoCanRep) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      pcVar1 = local_110.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x11c9,v_3,pcVar1,"st_NoCanRep",pcVar6);
      StrX::~StrX(&local_110);
      goto LAB_0012516c;
    }
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x11c9,v_3);
    StrX::~StrX(&local_110);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
LAB_0012516c:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_110,iv_1);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_110.fUnicodeForm,dt_gMonth,&myStatus,ver_10,iVar12 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (lVar7 == 0) {
    SVar10 = (uint)(iVar12 == 2) * 4 + st_NoCanRep;
    if (SVar10 != myStatus) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      pcVar1 = local_110.fLocalForm;
      pcVar6 = getStatusString(SVar10);
      pcVar8 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x11cd,iv_1,pcVar1,pcVar6,pcVar8);
      StrX::~StrX(&local_110);
      goto LAB_00125271;
    }
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x11cd,iv_1);
    StrX::~StrX(&local_110);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
LAB_00125271:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_110,iv_2);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_110.fUnicodeForm,dt_gMonth,&myStatus,ver_10,iVar12 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (lVar7 == 0) {
    SVar10 = (uint)(iVar12 == 2) * 4 + st_NoCanRep;
    if (SVar10 != myStatus) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      pcVar1 = local_110.fLocalForm;
      pcVar6 = getStatusString(SVar10);
      pcVar8 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x11cf,iv_2,pcVar1,pcVar6,pcVar8);
      StrX::~StrX(&local_110);
      goto LAB_0012537f;
    }
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x11cf,iv_2);
    StrX::~StrX(&local_110);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
LAB_0012537f:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_110,iv_3);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_110.fUnicodeForm,dt_gMonth,&myStatus,ver_10,iVar12 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (lVar7 == 0) goto LAB_0012541b;
  StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
  printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
         ,0x11d1,iv_3);
  StrX::~StrX(&local_110);
  (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
            (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
  goto LAB_00125484;
LAB_0012541b:
  SVar10 = (uint)(iVar12 == 2) * 4 + st_NoCanRep;
  iVar12 = iVar11;
  if (SVar10 != myStatus) {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
    pcVar1 = local_110.fLocalForm;
    pcVar6 = getStatusString(SVar10);
    pcVar8 = getStatusString(myStatus);
    printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x11d1,iv_3,pcVar1,pcVar6,pcVar8);
    StrX::~StrX(&local_110);
LAB_00125484:
    errSeen = 1;
    iVar12 = iVar11;
  }
  goto LAB_00124e91;
}

Assistant:

void test_dt_gMonth()
{
    const XSValue::DataType dt = XSValue::dt_gMonth;
    bool  toValidate = true;

    const char v_1[]="   --02+10:10   \n";
    const char v_2[]="--10-12:12";
    const char v_3[]="--12";

    const char iv_1[]="--+11";
    const char iv_2[]="---02.09";
    const char iv_3[]="--14--";

    XSValue::XSValue_Data act_v_ran_v_1;
    XSValue::XSValue_Data act_v_ran_v_2;
    XSValue::XSValue_Data act_v_ran_v_3;

    act_v_ran_v_1.fValue.f_datetime.f_year    = 0;
    act_v_ran_v_1.fValue.f_datetime.f_month   = 2;
    act_v_ran_v_1.fValue.f_datetime.f_day     = 0;
    act_v_ran_v_1.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_1.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_1.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_1.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_2.fValue.f_datetime.f_year    = 0;
    act_v_ran_v_2.fValue.f_datetime.f_month   = 10;
    act_v_ran_v_2.fValue.f_datetime.f_day     = 0;
    act_v_ran_v_2.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_2.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_2.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_2.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_3.fValue.f_datetime.f_year    = 0;
    act_v_ran_v_3.fValue.f_datetime.f_month   = 12;
    act_v_ran_v_3.fValue.f_datetime.f_day     = 0;
    act_v_ran_v_3.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_3.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_3.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_3.fValue.f_datetime.f_milisec = 0;

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                                     false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_2, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_3, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_2);
        ACTVALUE_TEST(iv_3, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_3);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_2, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_3, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));

    }

}